

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.h
# Opt level: O0

void __thiscall
mnf::CartesianProduct::CartesianProduct(CartesianProduct *this,CartesianProduct *param_1)

{
  CartesianProduct *param_1_local;
  CartesianProduct *this_local;
  
  Manifold::Manifold((Manifold *)this,(Manifold *)param_1);
  *(undefined **)this = &std::exception::vtable;
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::vector((vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
            *)(this + 0x58),
           (vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
            *)(param_1 + 0x58));
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)(this + 0x70),
             (vector<long,_std::allocator<long>_> *)(param_1 + 0x70));
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)(this + 0x88),
             (vector<long,_std::allocator<long>_> *)(param_1 + 0x88));
  return;
}

Assistant:

class MANIFOLDS_API CartesianProduct : public Manifold
{
 public:
  /// \brief Default constructor
  CartesianProduct();

  /// \brief Constructor of the manifold from a list of manifolds
  CartesianProduct(const std::initializer_list<Manifold*> m);

  /// \brief Constructor of the manifold composed of \f$ m1\times m2\f$
  CartesianProduct(const Manifold& m1, const Manifold& m2);

  /// \brief Adds manifold m to the current composed manifold\n
  /// This method cannot be executed if the manifold is locked
  CartesianProduct& multiply(const Manifold& m);

  virtual size_t numberOfSubManifolds() const;
  virtual const Manifold& operator()(const size_t i) const;

  virtual std::string description(const std::string& prefix = "",
                                  bool firstCall = true) const;
  virtual std::string toString(
      const ConstRefVec& val, const std::string& prefix = "",
      const Eigen::IOFormat& fmt = mnf::defaultFormat) const;

  virtual bool isElementary() const;
  virtual bool isSameTopology(const Manifold& other) const;

 protected:
  virtual bool isInM_(const Eigen::VectorXd& val, double prec) const;
  virtual void forceOnM_(RefVec out, const ConstRefVec& in) const;
  virtual void getIdentityOnTxM_(RefMat out, const ConstRefVec& x) const;

  virtual Index startR(const size_t i) const;
  virtual Index startT(const size_t i) const;

  virtual void createRandomPoint_(RefVec out, const double coeff) const;
  virtual void retractation_(RefVec out, const ConstRefVec& x,
                             const ConstRefVec& v) const;
  virtual void pseudoLog_(RefVec out, const ConstRefVec& x,
                          const ConstRefVec& y) const;
  virtual void pseudoLog0_(RefVec out, const ConstRefVec& x) const;
  virtual void setZero_(RefVec out) const;
  virtual Eigen::MatrixXd diffRetractation_(const ConstRefVec& x) const;
  virtual void applyDiffRetractation_(RefMat out, const ConstRefMat& in,
                                      const ConstRefVec& x) const;
  virtual Eigen::MatrixXd diffPseudoLog0_(const ConstRefVec& x) const;
  virtual void applyDiffPseudoLog0_(RefMat out, const ConstRefMat& in,
                                    const ConstRefVec& x) const;
  virtual void applyTransport_(RefMat out, const ConstRefMat& in,
                               const ConstRefVec& x,
                               const ConstRefVec& v) const;
  virtual void applyInvTransport_(RefMat out, const ConstRefMat& in,
                                  const ConstRefVec& x,
                                  const ConstRefVec& v) const;
  virtual void applyInvTransportOnTheRight_(RefMat out, const ConstRefMat& in,
                                            const ConstRefVec& x,
                                            const ConstRefVec& v) const;

  virtual void tangentConstraint_(RefMat out, const ConstRefVec& x) const;
  virtual bool isInTxM_(const ConstRefVec& x, const ConstRefVec& v,
                        const double& prec) const;
  virtual void forceOnTxM_(RefVec out, const ConstRefVec& in,
                           const ConstRefVec& x) const;
  virtual void limitMap_(RefVec out) const;
  virtual void getTypicalMagnitude_(RefVec out) const;
  virtual void getTrustMagnitude_(RefVec out) const;
  virtual long getTypeId() const;

  virtual std::shared_ptr<Manifold> getNewCopy_() const;

 protected:
  /// \brief List of pointers on all the manifolds in the cartesian product
  std::vector<std::shared_ptr<const Manifold>> subManifolds_;

 private:
  /// \brief List of start index of submanifolds in a vector of the
  /// tangent space
  std::vector<Index> startIndexT_;

  /// \brief List of start index of submanifolds in a vector of the
  /// representation space
  std::vector<Index> startIndexR_;
}